

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateDescriptor.cpp
# Opt level: O0

bool amrex::StateDescriptor::bf_thread_safety
               (int *param_1,int *param_2,int *param_3,int *param_4,int *bc,int ng)

{
  bool bVar1;
  bool bVar2;
  int i;
  bool has_ext_dir;
  bool thread_safe;
  int ng_local;
  int *bc_local;
  int *param_3_local;
  int *param_2_local;
  int *param_1_local;
  int *param_0_local;
  
  thread_safe = true;
  if (bf_ext_dir_threadsafe == 0) {
    bVar2 = false;
    i = 0;
    while( true ) {
      bVar1 = false;
      if (SBORROW4(i,ng * 6) != i + ng * -6 < 0) {
        bVar1 = (bool)(bVar2 ^ 1);
      }
      if (!bVar1) break;
      bVar2 = bc[i] == 3;
      i = i + 1;
    }
    thread_safe = !bVar2;
  }
  return thread_safe;
}

Assistant:

bool
StateDescriptor::bf_thread_safety (const int* /*lo*/,const int* /*hi*/,
                                   const int* /*dom_lo*/, const int* /*dom_hi*/,
                                   const int* bc, int ng)
{
    bool thread_safe = true;
    if (!bf_ext_dir_threadsafe) {
        bool has_ext_dir = false;
        for (int i=0; i<2*AMREX_SPACEDIM*ng && !has_ext_dir; ++i) {
            has_ext_dir = bc[i]==BCType::ext_dir;
        }
        if (has_ext_dir) thread_safe = false;
    }
    return thread_safe;
}